

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase490::run(TestCase490 *this)

{
  size_t sVar1;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  char *__s;
  ReaderOptions options;
  Reader value;
  ArrayPtr<const_unsigned_char> packedBytes;
  ArrayPtr<const_unsigned_char> packedBytes_00;
  ArrayPtr<capnp::word> scratchSpace;
  String huge;
  TestPipe pipe;
  DebugComparison<capnp::Text::Reader,_kj::String_&> _kjCondition_1;
  ArrayPtr<const_char> local_2288;
  Reader local_2278;
  TestMessageBuilder builder;
  PackedMessageReader reader;
  word scratch [1024];
  
  kj::heapString(&huge,0x139f);
  __s = (char *)huge.content.size_;
  if (huge.content.size_ != 0) {
    __s = huge.content.ptr;
  }
  memset(__s,0x78,0x139f);
  TestMessageBuilder::TestMessageBuilder(&builder,1);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)scratch,(MessageBuilder *)&builder);
  if (huge.content.size_ == 0) {
    huge.content.ptr = "";
  }
  value.super_StringPtr.content.size_ = huge.content.size_ + (huge.content.size_ == 0);
  value.super_StringPtr.content.ptr = huge.content.ptr;
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextField((Builder *)scratch,value);
  pipe.super_BufferedInputStream.super_InputStream._vptr_InputStream =
       (InputStream)&PTR__TestPipe_0035aef0;
  pipe.super_OutputStream._vptr_OutputStream = (_func_int **)&PTR__TestPipe_0035af30;
  pipe.preferredReadSize = 0xffffffffffffffff;
  pipe.data._M_dataplus._M_p = (pointer)&pipe.data.field_2;
  pipe.data._M_string_length = 0;
  pipe.data.field_2._M_local_buf[0] = '\0';
  pipe.readPos = 0;
  writePackedMessage(&pipe.super_OutputStream,(MessageBuilder *)&builder);
  sVar1 = computeSerializedSizeInWords((MessageBuilder *)&builder);
  packedBytes.size_ = extraout_RDX;
  packedBytes.ptr = (uchar *)pipe.data._M_string_length;
  scratch[1].content = computeUnpackedSizeInWords((capnp *)pipe.data._M_dataplus._M_p,packedBytes);
  scratch[2].content = (uint64_t)anon_var_dwarf_b08b;
  scratch[3].content = 5;
  scratch[4].content._0_1_ = sVar1 == scratch[1].content;
  scratch[0].content = sVar1;
  if ((!(bool)(undefined1)scratch[4].content) && (kj::_::Debug::minSeverity < 3)) {
    reader.super_PackedInputStream.super_InputStream._vptr_InputStream =
         (_func_int **)computeSerializedSizeInWords((MessageBuilder *)&builder);
    packedBytes_00.size_ = extraout_RDX_00;
    packedBytes_00.ptr = (uchar *)pipe.data._M_string_length;
    _kjCondition_1.left.super_StringPtr.content.ptr =
         (char *)computeUnpackedSizeInWords((capnp *)pipe.data._M_dataplus._M_p,packedBytes_00);
    kj::_::Debug::
    log<char_const(&)[106],kj::_::DebugComparison<unsigned_long,unsigned_long>&,unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed-test.c++"
               ,500,ERROR,
               "\"failed: expected \" \"(computeSerializedSizeInWords(builder)) == (computeUnpackedSizeInWords(pipe.getArray()))\", _kjCondition, computeSerializedSizeInWords(builder), computeUnpackedSizeInWords(pipe.getArray())"
               ,(char (*) [106])
                "failed: expected (computeSerializedSizeInWords(builder)) == (computeUnpackedSizeInWords(pipe.getArray()))"
               ,(DebugComparison<unsigned_long,_unsigned_long> *)scratch,(unsigned_long *)&reader,
               (unsigned_long *)&_kjCondition_1);
  }
  options._8_8_ = 0x40;
  options.traversalLimitInWords = 0x800000;
  scratchSpace.size_ = 0x400;
  scratchSpace.ptr = scratch;
  PackedMessageReader::PackedMessageReader
            (&reader,&pipe.super_BufferedInputStream,options,scratchSpace);
  MessageReader::getRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_2278,&reader.super_InputStreamMessageReader.super_MessageReader);
  local_2288 = (ArrayPtr<const_char>)
               capnproto_test::capnp::test::TestAllTypes::Reader::getTextField(&local_2278);
  kj::_::DebugExpression<capnp::Text::Reader>::operator==
            (&_kjCondition_1,(DebugExpression<capnp::Text::Reader> *)&local_2288,&huge);
  if ((_kjCondition_1.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[71],kj::_::DebugComparison<capnp::Text::Reader,kj::String&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed-test.c++"
               ,0x1f8,ERROR,
               "\"failed: expected \" \"reader.getRoot<TestAllTypes>().getTextField() == huge\", _kjCondition"
               ,(char (*) [71])
                "failed: expected reader.getRoot<TestAllTypes>().getTextField() == huge",
               &_kjCondition_1);
  }
  PackedMessageReader::~PackedMessageReader(&reader);
  TestPipe::~TestPipe(&pipe);
  TestMessageBuilder::~TestMessageBuilder(&builder);
  kj::Array<char>::~Array(&huge.content);
  return;
}

Assistant:

TEST(Packed, RoundTripHugeStringScratchSpace) {
  kj::String huge = kj::heapString(5023);
  memset(huge.begin(), 'x', 5023);

  TestMessageBuilder builder(1);
  builder.initRoot<TestAllTypes>().setTextField(huge);

  TestPipe pipe;
  writePackedMessage(pipe, builder);

  EXPECT_EQ(computeSerializedSizeInWords(builder), computeUnpackedSizeInWords(pipe.getArray()));

  word scratch[1024];
  PackedMessageReader reader(pipe, ReaderOptions(), kj::ArrayPtr<word>(scratch, 1024));
  EXPECT_TRUE(reader.getRoot<TestAllTypes>().getTextField() == huge);
}